

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::
unregisterAll(RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this)

{
  HitCounter **ppHVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  HitCounter **curr;
  HitCounter **pointer;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->
            super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
            ).super_ThreadSafe._vptr_ThreadSafe[9])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
    ppHVar1 = (HitCounter **)((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
    for (pointer = *(HitCounter ***)CONCAT44(extraout_var,iVar2); pointer != ppHVar1;
        pointer = pointer + 1) {
      safeDelete<el::base::HitCounter>(pointer);
    }
    iVar2 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
    plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
    if (plVar3[1] != *plVar3) {
      plVar3[1] = *plVar3;
    }
  }
  return;
}

Assistant:

virtual void unregisterAll(void) ELPP_FINAL {
    if (!this->empty()) {
      for (auto&& curr : this->list()) {
        base::utils::safeDelete(curr);
      }
      this->list().clear();
    }
  }